

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui.cpp
# Opt level: O2

void __thiscall CUI::DoTooltip(CUI *this,void *pID,CUIRect *pRect,char *pText)

{
  float fVar1;
  float fVar2;
  float fVar3;
  bool bVar4;
  
  bVar4 = MouseHovered(this,pRect);
  if (bVar4) {
    this->m_pActiveTooltip = pID;
    fVar1 = pRect->y;
    fVar2 = pRect->w;
    fVar3 = pRect->h;
    (this->m_TooltipAnchor).x = pRect->x;
    (this->m_TooltipAnchor).y = fVar1;
    (this->m_TooltipAnchor).w = fVar2;
    (this->m_TooltipAnchor).h = fVar3;
    str_copy(this->m_aTooltipText,pText,0x100);
    return;
  }
  if (this->m_pActiveTooltip == pID) {
    this->m_pActiveTooltip = (void *)0x0;
    this->m_aTooltipText[0] = '\0';
  }
  return;
}

Assistant:

void CUI::DoTooltip(const void *pID, const CUIRect *pRect, const char *pText)
{
	if(MouseHovered(pRect))
	{
		m_pActiveTooltip = pID;
		m_TooltipAnchor = *pRect;
		str_copy(m_aTooltipText, pText, sizeof(m_aTooltipText));
	}
	else if(m_pActiveTooltip == pID)
	{
		m_pActiveTooltip = 0;
		m_aTooltipText[0] = '\0';
	}
}